

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,_4U>::normalize(ImageT<unsigned_short,_4U> *this)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = (this->super_Image).height * (this->super_Image).width;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      color<unsigned_short,_4U>::normalize
                ((color<unsigned_short,_4U> *)((long)&this->pixels->field_0 + lVar2));
      lVar2 = lVar2 + 8;
    } while ((ulong)uVar1 << 3 != lVar2);
  }
  return this;
}

Assistant:

virtual ImageT& normalize() override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            c.normalize();
        }
        return *this;
    }